

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_import(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_GEOM pRVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  REF_GRID freeable_ref_grid;
  REF_NODE local_58;
  REF_FACELIFT ref_facelift;
  REF_DBL local_48 [3];
  
  uVar5 = ref_import_by_extension(&freeable_ref_grid,ref_grid->mpi,filename);
  if (uVar5 == 0) {
    pRVar2 = freeable_ref_grid->geom;
    uVar5 = ref_geom_share_context(pRVar2,ref_grid->geom);
    if (uVar5 == 0) {
      if (pRVar2->model != (void *)0x0) {
        uVar5 = ref_egads_mark_jump_degen(freeable_ref_grid);
        if (uVar5 != 0) {
          pcVar8 = "T and UV jumps; UV degen";
          uVar6 = 0x1e2;
          goto LAB_001b21ba;
        }
        uVar5 = ref_geom_verify_topo(freeable_ref_grid);
        if (uVar5 != 0) {
          pcVar8 = "geom topo";
          uVar6 = 0x1e3;
          goto LAB_001b21ba;
        }
        uVar5 = ref_geom_verify_param(freeable_ref_grid);
        if (uVar5 != 0) {
          pcVar8 = "geom param";
          uVar6 = 0x1e4;
          goto LAB_001b21ba;
        }
      }
      uVar5 = ref_facelift_create(&ref_facelift,freeable_ref_grid,0);
      if (uVar5 == 0) {
        ref_grid->geom->ref_facelift = ref_facelift;
        if (ref_facelift->displacement != (REF_DBL *)0x0) {
          local_58 = ref_facelift->grid->node;
          pRVar2 = ref_facelift->grid->geom;
          lVar10 = 0;
          lVar9 = 0;
          do {
            if (pRVar2->max <= lVar9) {
              return 0;
            }
            if (pRVar2->descr[lVar9 * 6] != -1) {
              uVar5 = ref_egads_eval(pRVar2,(REF_INT)lVar9,local_48,(REF_DBL *)0x0);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x1ca,"ref_facelift_infer_displacement",(ulong)uVar5,"eval geom");
                goto LAB_001b23ca;
              }
              iVar1 = pRVar2->descr[lVar9 * 6 + 5];
              pRVar3 = local_58->real;
              pRVar4 = ref_facelift->displacement;
              for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
                *(double *)((long)pRVar4 + lVar7 * 8 + lVar10) =
                     pRVar3[iVar1 * 0xf + lVar7] - local_48[lVar7];
              }
            }
            lVar9 = lVar9 + 1;
            lVar10 = lVar10 + 0x18;
          } while( true );
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1c7,"ref_facelift_infer_displacement","requires indirect facelift");
        uVar5 = 1;
LAB_001b23ca:
        pcVar8 = "infer displacement";
        uVar6 = 0x1e9;
      }
      else {
        pcVar8 = "create";
        uVar6 = 0x1e7;
      }
    }
    else {
      pcVar8 = "share context";
      uVar6 = 0x1df;
    }
  }
  else {
    pcVar8 = "import";
    uVar6 = 0x1dc;
  }
LAB_001b21ba:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar6,
         "ref_facelift_import",(ulong)uVar5,pcVar8);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_import(REF_GRID ref_grid,
                                       const char *filename) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_GEOM ref_geom;
  RSS(ref_import_by_extension(&freeable_ref_grid, ref_grid_mpi(ref_grid),
                              filename),
      "import");
  ref_geom = ref_grid_geom(freeable_ref_grid);
  RSS(ref_geom_share_context(ref_geom, ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_mark_jump_degen(freeable_ref_grid),
        "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(freeable_ref_grid), "geom topo");
    RSS(ref_geom_verify_param(freeable_ref_grid), "geom param");
  }
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_infer_displacement(ref_facelift), "infer displacement");
  return REF_SUCCESS;
}